

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O3

void __thiscall QGroupBox::setChecked(QGroupBox *this,bool b)

{
  QGroupBoxPrivate *this_00;
  long in_FS_OFFSET;
  undefined1 local_61;
  code *local_60;
  undefined8 local_58;
  QGroupBox *pQStack_50;
  undefined8 local_48;
  undefined8 local_40;
  void *local_38;
  undefined1 *local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGroupBoxPrivate **)&(this->super_QWidget).field_0x8;
  if ((this_00->checkable == true) && (this_00->checked != b)) {
    QWidget::update(&this->super_QWidget);
    this_00->checked = b;
    QGroupBoxPrivate::_q_setChildrenEnabled(this_00,b);
    local_48 = 0xaaaaaaaaffffffff;
    local_60 = QCss::ValueExtractor::extractGeometry;
    local_40 = 0x40;
    local_58 = 0xaaaaaaaa0000800a;
    pQStack_50 = this;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_60);
    local_30 = &local_61;
    local_38 = (void *)0x0;
    local_61 = b;
    QMetaObject::activate((QObject *)this,&staticMetaObject,2,&local_38);
    QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent
              ((QAccessibleStateChangeEvent *)&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGroupBox::setChecked(bool b)
{
    Q_D(QGroupBox);
    if (d->checkable && b != d->checked) {
        update();
        d->checked = b;
        d->_q_setChildrenEnabled(b);
#if QT_CONFIG(accessibility)
        QAccessible::State st;
        st.checked = true;
        QAccessibleStateChangeEvent e(this, st);
        QAccessible::updateAccessibility(&e);
#endif
        emit toggled(b);
    }
}